

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ScalarReplacementPass::CopyPointerDecorationsToVariable
          (ScalarReplacementPass *this,Instruction *from,Instruction *to)

{
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  uint32_t id;
  DecorationManager *this_00;
  reference ppIVar2;
  IRContext *pIVar3;
  Instruction *pIVar4;
  pointer this_01;
  uint32_t local_a4;
  iterator local_a0;
  undefined8 local_98;
  SmallVector<unsigned_int,_2UL> local_90;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_68;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_dec_inst;
  uint32_t decoration;
  Instruction *dec_inst;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  Instruction *to_local;
  Instruction *from_local;
  ScalarReplacementPass *this_local;
  
  this_00 = Pass::get_decoration_mgr((Pass *)this);
  id = opt::Instruction::result_id(from);
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__begin2,this_00,id,false);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__begin2);
  dec_inst = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__begin2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                     *)&dec_inst), bVar1) {
    ppIVar2 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    pIVar4 = *ppIVar2;
    new_dec_inst._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
         opt::Instruction::GetSingleWordInOperand(pIVar4,1);
    if (new_dec_inst._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ == 0x14eb ||
        new_dec_inst._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ == 0x14ec) {
      pIVar3 = Pass::context((Pass *)this);
      pIVar4 = opt::Instruction::Clone(pIVar4,pIVar3);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_68,pIVar4);
      this_01 = std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::operator->(&local_68);
      local_a4 = opt::Instruction::result_id(to);
      local_a0 = &local_a4;
      local_98 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_a0;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list);
      opt::Instruction::SetInOperand(this_01,0,&local_90);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
      pIVar3 = Pass::context((Pass *)this);
      IRContext::AddAnnotationInst(pIVar3,&local_68);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_68);
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__begin2);
  return;
}

Assistant:

void ScalarReplacementPass::CopyPointerDecorationsToVariable(Instruction* from,
                                                             Instruction* to) {
  // The RestrictPointer and AliasedPointer decorations are copied to all
  // members even if the new variable does not contain a pointer. It does
  // not hurt to do so.
  for (auto dec_inst :
       get_decoration_mgr()->GetDecorationsFor(from->result_id(), false)) {
    uint32_t decoration;
    decoration = dec_inst->GetSingleWordInOperand(1u);
    switch (spv::Decoration(decoration)) {
      case spv::Decoration::AliasedPointer:
      case spv::Decoration::RestrictPointer: {
        std::unique_ptr<Instruction> new_dec_inst(dec_inst->Clone(context()));
        new_dec_inst->SetInOperand(0, {to->result_id()});
        context()->AddAnnotationInst(std::move(new_dec_inst));
      } break;
      default:
        break;
    }
  }
}